

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall Annotator_automaticIdsMath_Test::TestBody(Annotator_automaticIdsMath_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  AnnotatorPtr annotator;
  ModelPtr model;
  ParserPtr parser;
  long *local_78;
  AssertHelper local_70 [8];
  byte local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long *local_38 [2];
  long local_28 [2];
  undefined1 local_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  libcellml::Parser::create(SUB81(local_18,0));
  libcellml::Parser::parseModel(local_48);
  libcellml::Annotator::create();
  libcellml::Annotator::setModel(local_58);
  bVar1 = libcellml::Annotator::assignIds((CellmlElementType)local_58);
  local_68[0] = bVar1 ^ 1;
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_68,
               "annotator->assignIds(libcellml::CellmlElementType::MATH)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x3fb,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_78 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

TEST(Annotator, automaticIdsMath)
{
    // Adding test for coverage purposes.
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);
    auto annotator = libcellml::Annotator::create();

    annotator->setModel(model);

    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::MATH));
}